

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O0

void __thiscall
CaDiCaL::Proof::add_derived_clause
          (Proof *this,Clause *c,vector<unsigned_long,_std::allocator<unsigned_long>_> *chain)

{
  bool bVar1;
  const_iterator this_00;
  reference __x;
  Proof *in_RDX;
  undefined8 *in_RSI;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_RDI;
  unsigned_long *cid;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffd8;
  Proof *in_stack_ffffffffffffffe0;
  
  add_literals(in_stack_ffffffffffffffe0,(Clause *)in_stack_ffffffffffffffd8._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffffb8);
  this_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                      (in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       *)&stack0xffffffffffffffd8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00._M_current,__x);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&stack0xffffffffffffffd8);
  }
  in_RDI[7]._M_current = (unsigned_long *)*in_RSI;
  *(byte *)&in_RDI[8]._M_current = (byte)(*(uint *)(in_RSI + 1) >> 0xb) & 1;
  add_derived_clause(in_RDX);
  return;
}

Assistant:

void Proof::add_derived_clause (Clause *c, const vector<uint64_t> &chain) {
  LOG (c, "PROOF adding to proof derived");
  assert (clause.empty ());
  assert (proof_chain.empty ());
  add_literals (c);
  for (const auto &cid : chain)
    proof_chain.push_back (cid);
  clause_id = c->id;
  redundant = c->redundant;
  add_derived_clause ();
}